

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnArrayType
          (BinaryReaderIR *this,Index index,TypeMut type_mut)

{
  Module *this_00;
  undefined1 uVar1;
  bool bVar2;
  pointer pAVar3;
  pointer pTVar4;
  Type ty;
  unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_> local_80;
  Type local_78;
  Type local_70;
  unique_ptr<wabt::ArrayType,_std::default_delete<wabt::ArrayType>_> local_68;
  __single_object array_type;
  undefined1 local_40 [8];
  __single_object field;
  Index index_local;
  BinaryReaderIR *this_local;
  Enum local_20;
  TypeMut type_mut_local;
  
  ty = type_mut.type;
  local_20 = CONCAT31(local_20._1_3_,type_mut.mutable_);
  type_mut_local.type.enum_ = local_20;
  field._M_t.
  super___uniq_ptr_impl<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>._M_t.
  super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>.
  super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl._4_4_ = index;
  GetLocation((Location *)&array_type,this);
  std::make_unique<wabt::TypeModuleField,wabt::Location>((Location *)local_40);
  std::make_unique<wabt::ArrayType>();
  pAVar3 = std::unique_ptr<wabt::ArrayType,_std::default_delete<wabt::ArrayType>_>::operator->
                     (&local_68);
  (pAVar3->field).type = ty;
  uVar1 = (undefined1)type_mut_local.type.enum_;
  pAVar3 = std::unique_ptr<wabt::ArrayType,_std::default_delete<wabt::ArrayType>_>::operator->
                     (&local_68);
  (pAVar3->field).mutable_ = (bool)(uVar1 & ~I64);
  local_70 = ty;
  bVar2 = wabt::operator==(ty,V128);
  (this->module_->features_used).simd = ((this->module_->features_used).simd & 1U) != 0 || bVar2;
  local_78 = ty;
  bVar2 = wabt::operator==(ty,ExnRef);
  (this->module_->features_used).exceptions =
       ((this->module_->features_used).exceptions & 1U) != 0 || bVar2;
  pTVar4 = std::unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>::
           operator->((unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>
                       *)local_40);
  std::unique_ptr<wabt::TypeEntry,std::default_delete<wabt::TypeEntry>>::operator=
            ((unique_ptr<wabt::TypeEntry,std::default_delete<wabt::TypeEntry>> *)&pTVar4->type,
             &local_68);
  this_00 = this->module_;
  std::unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>::unique_ptr
            (&local_80,
             (unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_> *)
             local_40);
  Module::AppendField(this_00,&local_80);
  std::unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>::~unique_ptr
            (&local_80);
  Result::Result((Result *)&type_mut_local.type.type_index_,Ok);
  std::unique_ptr<wabt::ArrayType,_std::default_delete<wabt::ArrayType>_>::~unique_ptr(&local_68);
  std::unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>::~unique_ptr
            ((unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_> *)
             local_40);
  return (Result)type_mut_local.type.type_index_;
}

Assistant:

Result BinaryReaderIR::OnArrayType(Index index, TypeMut type_mut) {
  auto field = std::make_unique<TypeModuleField>(GetLocation());
  auto array_type = std::make_unique<ArrayType>();
  array_type->field.type = type_mut.type;
  array_type->field.mutable_ = type_mut.mutable_;
  module_->features_used.simd |= (type_mut.type == Type::V128);
  module_->features_used.exceptions |= (type_mut.type == Type::ExnRef);
  field->type = std::move(array_type);
  module_->AppendField(std::move(field));
  return Result::Ok;
}